

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recvstate.c
# Opt level: O2

int quicly_recvstate_reset(quicly_recvstate_t *state,uint64_t eos_at,uint64_t *bytes_missing)

{
  uint64_t *puVar1;
  size_t sVar2;
  int iVar3;
  
  sVar2 = (state->received).num_ranges;
  if (sVar2 != 0) {
    iVar3 = 0x20006;
    if ((state->eos == 0xffffffffffffffff || state->eos == eos_at) &&
       (puVar1 = &(state->received).ranges[sVar2 - 1].end, *puVar1 <= eos_at)) {
      *bytes_missing = eos_at - *puVar1;
      quicly_ranges_clear(&state->received);
      iVar3 = 0;
    }
    return iVar3;
  }
  __assert_fail("!quicly_recvstate_transfer_complete(state)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/recvstate.c"
                ,0x60,"int quicly_recvstate_reset(quicly_recvstate_t *, uint64_t, uint64_t *)");
}

Assistant:

int quicly_recvstate_reset(quicly_recvstate_t *state, uint64_t eos_at, uint64_t *bytes_missing)
{
    assert(!quicly_recvstate_transfer_complete(state));

    /* validate */
    if (state->eos != UINT64_MAX && state->eos != eos_at)
        return QUICLY_TRANSPORT_ERROR_FINAL_SIZE;
    if (eos_at < state->received.ranges[state->received.num_ranges - 1].end)
        return QUICLY_TRANSPORT_ERROR_FINAL_SIZE;

    /* calculate bytes missing */
    *bytes_missing = eos_at - state->received.ranges[state->received.num_ranges - 1].end;

    /* clear the received range */
    quicly_ranges_clear(&state->received);

    return 0;
}